

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendReceiver.cpp
# Opt level: O3

string * __thiscall
SendReceiver::sendInfoRequest(string *__return_storage_ptr__,SendReceiver *this,string *id)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string link;
  size_type *local_60;
  size_type local_50;
  undefined8 uStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_40,"https://anonfile.com/api/v2/file/",id);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_40,"/info");
  local_60 = (size_type *)(pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60 == paVar4) {
    local_50 = paVar4->_M_allocated_capacity;
    uStack_48 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_60 = &local_50;
  }
  else {
    local_50 = paVar4->_M_allocated_capacity;
  }
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  lVar3 = curl_easy_init();
  if (lVar3 != 0) {
    curl_easy_setopt(lVar3,0x2712,local_60);
    curl_easy_setopt(lVar3,0x34,1);
    curl_easy_setopt(lVar3,0x4e2b,writeCallback);
    curl_easy_setopt(lVar3,0x2711,__return_storage_ptr__);
    iVar1 = curl_easy_perform(lVar3);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error, check your internet connection!\n",0x27);
    }
  }
  curl_easy_cleanup(lVar3);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SendReceiver::sendInfoRequest(const std::string& id) {
  std::string data;
  std::string link = Anonfiles::Fileinfo + id + "/info";
  CURL* curl = curl_easy_init();
  CURLcode res;

  if (curl) {
    curl_easy_setopt(curl, CURLOPT_URL, link.c_str());

#ifndef LINUX
    curl_easy_setopt(curl, CURLOPT_SSLCERTTYPE, "PEM");
    curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1L);
    curl_easy_setopt(curl, CURLOPT_CAINFO, NULL);
    curl_easy_setopt(curl, CURLOPT_CAPATH, NULL);
    curl_easy_setopt(curl, CURLOPT_FRESH_CONNECT, 1L);
    curl_easy_setopt(curl, CURLOPT_SSL_CTX_FUNCTION, *sslctx_function); // set void* and load cacert.pem from memory
#endif

    curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, &writeCallback);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, &data);

    res = curl_easy_perform(curl);
    if (res != CURLE_OK)
      std::cout << "Error, check your internet connection!\n";
  }

  curl_easy_cleanup(curl);

  return data;
}